

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_workgroup_initialization(CompilerMSL *this,SPIRVariable *var)

{
  BaseType BVar1;
  SPIRType *pSVar2;
  char (*ts_1) [8];
  string var_name;
  string var_pos_name;
  string var_ptr_name;
  string var_size_name;
  string var_ptr2_name;
  string var_stride_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pSVar2 = Compiler::get_variable_data_type((Compiler *)this,var);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  if ((pSVar2->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size == 0 && (pSVar2->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    BVar1 = pSVar2->basetype;
    if (BVar1 == Boolean) {
      pSVar2->basetype = Short;
    }
    CompilerGLSL::statement<char_const(&)[34]>
              (&this->super_CompilerGLSL,(char (*) [34])"if (gl_LocalInvocationIndex == 0)");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_e0,this,(ulong)(var->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])(&local_a0,this,var);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_e0,(char (*) [4])0x2d6e67,&local_a0,
               (char (*) [2])0x2d6cfb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    if (BVar1 == Boolean) {
      pSVar2->basetype = Boolean;
    }
  }
  else {
    ts_1 = (char (*) [8])0x1;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_e0,this,(ulong)(var->super_IVariant).self.id);
    join<std::__cxx11::string&,char_const(&)[5]>
              (&local_a0,(spirv_cross *)&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_ptr",
               (char (*) [5])ts_1);
    join<std::__cxx11::string&,char_const(&)[4]>
              (&local_80,(spirv_cross *)&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_sz",
               (char (*) [4])ts_1);
    join<std::__cxx11::string&,char_const(&)[5]>
              (&local_c0,(spirv_cross *)&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_pos",
               (char (*) [5])ts_1);
    join<std::__cxx11::string&,char_const(&)[8]>
              (&local_40,(spirv_cross *)&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb6ef,ts_1);
    join<std::__cxx11::string&,char_const(&)[6]>
              (&local_60,(spirv_cross *)&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_ptr2",
               (char (*) [6])ts_1);
    CompilerGLSL::
    statement<char_const(&)[19],std::__cxx11::string&,char_const(&)[25],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [19])"threadgroup uint *",&local_a0,
               (char (*) [25])" = (threadgroup uint *)&",&local_e0,(char (*) [2])0x2d6cfb);
    CompilerGLSL::
    statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[4],char_const(&)[8],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [6])"uint ",&local_80,(char (*) [4])0x2d6e67,
               (char (*) [8])"sizeof(",&local_e0,(char (*) [3])0x2bc7e1);
    CompilerGLSL::statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[28]>
              (&this->super_CompilerGLSL,(char (*) [6])"uint ",&local_c0,(char (*) [28])0x2d6981);
    CompilerGLSL::statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[65]>
              (&this->super_CompilerGLSL,(char (*) [6])"uint ",&local_40,
               (char (*) [65])" = gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z;");
    CompilerGLSL::
    statement<char_const(&)[23],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [23])"while (sizeof(uint) * ",&local_c0,
               (char (*) [4])" < ",&local_80,(char (*) [2])0x2bd856);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[8]>
              (&this->super_CompilerGLSL,&local_a0,(char (*) [2])0x2c1a1a,&local_c0,
               (char (*) [8])"] = 0u;");
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[5],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_c0,(char (*) [5])" += ",&local_40,
               (char (*) [2])0x2d6cfb);
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[34]>
              (&this->super_CompilerGLSL,(char (*) [34])"if (gl_LocalInvocationIndex == 0)");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[5],std::__cxx11::string&,char_const(&)[33]>
              (&this->super_CompilerGLSL,&local_c0,(char (*) [5])0x2d3d27,&local_80,
               (char (*) [33])" / sizeof(uint)) * sizeof(uint);");
    CompilerGLSL::
    statement<char_const(&)[20],std::__cxx11::string&,char_const(&)[26],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [20])"threadgroup uchar *",&local_60,
               (char (*) [26])" = (threadgroup uchar *)&",&local_e0,(char (*) [2])0x2d6cfb);
    CompilerGLSL::
    statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [8])"while (",&local_c0,(char (*) [4])" < ",
               &local_80,(char (*) [2])0x2bd856);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[10]>
              (&this->super_CompilerGLSL,&local_60,(char (*) [2])0x2c1a1a,&local_c0,
               (char (*) [10])"] = \'\\0\';");
    CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,&local_c0,(char (*) [4])"++;");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  CompilerGLSL::statement<char_const(&)[49]>
            (&this->super_CompilerGLSL,
             (char (*) [49])"threadgroup_barrier(mem_flags::mem_threadgroup);");
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerMSL::emit_workgroup_initialization(const SPIRVariable &var)
{
	auto &type = get_variable_data_type(var);

	begin_scope();

	if (type.array.empty() && type.member_types.empty())
	{
		// For simple shared variables, we just initialize it in thread 0 of the block
		// We use short to represent bool for threadgroup variable to workaround compiler bug,
		// so we do a temporary fixup here. Alas. (see the type_to_glsl method)
		bool is_boolean = type.basetype == SPIRType::Boolean;
		if (is_boolean)
			type.basetype = SPIRType::Short;

		statement("if (gl_LocalInvocationIndex == 0)");
		begin_scope();
		statement(to_name(var.self), " = ", to_initializer_expression(var), ";");
		end_scope();

		if (is_boolean)
			type.basetype = SPIRType::Boolean;
	}
	else
	{
		// Otherwise, we use a loop to cooperatively initialize the memory within the group

		// First, we define a few variable names;
		string var_name = to_name(var.self);
		string var_ptr_name = join(var_name, "_ptr");
		string var_size_name = join(var_name, "_sz");
		string var_pos_name = join(var_name, "_pos");
		string var_stride_name = join(var_name, "_stride");
		string var_ptr2_name = join(var_name, "_ptr2");

		statement("threadgroup uint *", var_ptr_name, " = (threadgroup uint *)&", var_name, ";");
		statement("uint ", var_size_name, " = ", "sizeof(", var_name, ");");
		statement("uint ", var_pos_name, " = gl_LocalInvocationIndex;");
		statement("uint ", var_stride_name, " = gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z;");

		statement("while (sizeof(uint) * ", var_pos_name, " < ", var_size_name, ")");
		begin_scope();
		statement(var_ptr_name, "[", var_pos_name, "] = 0u;");
		statement(var_pos_name, " += ", var_stride_name, ";");
		end_scope();

		statement("if (gl_LocalInvocationIndex == 0)");
		begin_scope();
		statement(var_pos_name, " = (", var_size_name, " / sizeof(uint)) * sizeof(uint);");
		statement("threadgroup uchar *", var_ptr2_name, " = (threadgroup uchar *)&", var_name, ";");

		statement("while (", var_pos_name, " < ", var_size_name, ")");
		begin_scope();
		statement(var_ptr2_name, "[", var_pos_name, "] = '\\0';");
		statement(var_pos_name, "++;");
		end_scope();
		end_scope();
	}

	statement("threadgroup_barrier(mem_flags::mem_threadgroup);");

	end_scope();
}